

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprVectorSize(Expr *pExpr)

{
  u8 local_19;
  u8 op;
  Expr *pExpr_local;
  
  local_19 = pExpr->op;
  if (local_19 == 0x9d) {
    local_19 = pExpr->op2;
  }
  if (local_19 == 0x9e) {
    pExpr_local._4_4_ = ((pExpr->x).pList)->nExpr;
  }
  else if (local_19 == 'w') {
    pExpr_local._4_4_ = ((pExpr->x).pSelect)->pEList->nExpr;
  }
  else {
    pExpr_local._4_4_ = 1;
  }
  return pExpr_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprVectorSize(Expr *pExpr){
  u8 op = pExpr->op;
  if( op==TK_REGISTER ) op = pExpr->op2;
  if( op==TK_VECTOR ){
    return pExpr->x.pList->nExpr;
  }else if( op==TK_SELECT ){
    return pExpr->x.pSelect->pEList->nExpr;
  }else{
    return 1;
  }
}